

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O0

void j1939cat_print_timestamp(j1939cat_priv *priv,char *name,timespec *cur)

{
  long *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  j1939cat_stats *stats;
  
  if (*in_RDX != 0 || in_RDX[1] != 0) {
    fprintf(_stderr,"  %s: %llu s %llu us (seq=%03u, send=%07u)",in_RSI,*in_RDX,
            (ulong)in_RDX[1] / 1000,(ulong)*(uint *)(in_RDI + 0x84),*(undefined4 *)(in_RDI + 0x88));
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

static void j1939cat_print_timestamp(struct j1939cat_priv *priv, const char *name,
			      struct timespec *cur)
{
	struct j1939cat_stats *stats = &priv->stats;

	if (!(cur->tv_sec | cur->tv_nsec))
		return;

	fprintf(stderr, "  %s: %llu s %llu us (seq=%03u, send=%07u)",
			name, (unsigned long long)cur->tv_sec, (unsigned long long)cur->tv_nsec / 1000,
			stats->tskey, stats->send);

	fprintf(stderr, "\n");
}